

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

bool Js::FunctionProxy::SetDisplayName
               (char16 *srcName,WriteBarrierPtr<const_char16_t> *destName,uint displayNameLength,
               ScriptContext *scriptContext,SetDisplayNameFlags flags)

{
  bool bVar1;
  WriteBarrierPtr<const_char16_t> local_28;
  char16 *dest;
  
  local_28.ptr = (char16_t *)0x0;
  bVar1 = SetDisplayName(srcName,&local_28.ptr,displayNameLength,scriptContext,flags);
  if (bVar1) {
    Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierSet(destName,local_28.ptr);
  }
  else {
    destName->ptr = (char16_t *)local_28;
  }
  return bVar1;
}

Assistant:

bool FunctionProxy::SetDisplayName(const char16* srcName, WriteBarrierPtr<const char16>* destName, uint displayNameLength, ScriptContext * scriptContext, SetDisplayNameFlags flags /* default to None */)
    {
        const char16* dest = nullptr;
        bool targetIsRecyclerMemory = SetDisplayName(srcName, &dest, displayNameLength, scriptContext, flags);

        if (targetIsRecyclerMemory)
        {
            *destName = dest;
        }
        else
        {
            destName->NoWriteBarrierSet(dest);
        }
        return targetIsRecyclerMemory;
    }